

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::_InternalParse
          (SoundAnalysisPreprocessing *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  SoundAnalysisPreprocessing_Vggish *msg;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
    if (bVar1) {
      return local_40;
    }
    local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
    tag_00 = local_34;
    if (local_34 == 0xa2) {
      msg = _internal_mutable_vggish(this);
      local_40 = google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg->super_MessageLite,local_40);
    }
    else {
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      local_40 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
    }
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* SoundAnalysisPreprocessing::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing.Vggish vggish = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          ptr = ctx->ParseMessage(_internal_mutable_vggish(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}